

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O1

base_uint<256U> * __thiscall base_uint<256U>::operator<<=(base_uint<256U> *this,uint shift)

{
  sbyte sVar1;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  base_uint<256U> a;
  base_uint<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&local_38,this);
  this->pn[4] = 0;
  this->pn[5] = 0;
  this->pn[6] = 0;
  this->pn[7] = 0;
  this->pn[0] = 0;
  this->pn[1] = 0;
  this->pn[2] = 0;
  this->pn[3] = 0;
  uVar2 = (ulong)(shift >> 5);
  sVar1 = (sbyte)(shift & 0x1f);
  lVar3 = 0;
  do {
    if (uVar2 < 7 && (shift & 0x1f) != 0) {
      this->pn[uVar2 + 1] = this->pn[uVar2 + 1] | local_38.pn[lVar3] >> (0x20U - sVar1 & 0x1f);
    }
    if (uVar2 < 8) {
      this->pn[uVar2] = this->pn[uVar2] | local_38.pn[lVar3] << sVar1;
    }
    lVar3 = lVar3 + 1;
    uVar2 = uVar2 + 1;
  } while (lVar3 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator<<=(unsigned int shift)
{
    base_uint<BITS> a(*this);
    for (int i = 0; i < WIDTH; i++)
        pn[i] = 0;
    int k = shift / 32;
    shift = shift % 32;
    for (int i = 0; i < WIDTH; i++) {
        if (i + k + 1 < WIDTH && shift != 0)
            pn[i + k + 1] |= (a.pn[i] >> (32 - shift));
        if (i + k < WIDTH)
            pn[i + k] |= (a.pn[i] << shift);
    }
    return *this;
}